

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgcep.cc
# Opt level: O2

int main(int argc,char **argv)

{
  InputOutputFormats IVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  ostream *poVar7;
  istream *input_stream;
  char *pcVar8;
  long lVar9;
  allocator local_120d;
  int num_order;
  int fft_length;
  InputOutputFormats local_1204;
  string local_1200;
  int impulse_response_length;
  int num_iteration;
  double alpha;
  double gamma;
  double relative_floor_in_decibels;
  double epsilon;
  ulong local_11b8;
  double convergence_threshold;
  vector<double,_std::allocator<double>_> input;
  double power;
  vector<double,_std::allocator<double>_> processed_input;
  ostringstream error_message_17;
  vector<double,_std::allocator<double>_> output;
  Buffer buffer_for_power_normalization;
  MelGeneralizedCepstralAnalysis analysis;
  GeneralizedCepstrumGainNormalization generalized_cepstrum_gain_normalization;
  MelCepstrumToMlsaDigitalFilterCoefficients mel_cepstrum_to_mlsa_digital_filter_coefficients;
  SpectrumToSpectrum spectrum_to_spectrum;
  ifstream ifs;
  undefined4 uStack_c24;
  byte abStack_c08 [488];
  Buffer buffer_for_cepstral_analysis;
  MelCepstrumPowerNormalization mel_cepstrum_power_normalization;
  Buffer buffer_for_spectral_analysis;
  WaveformToSpectrum waveform_to_spectrum;
  
  num_order = 0x19;
  gamma = 0.0;
  alpha = 0.35;
  fft_length = 0x100;
  num_iteration = 0x1e;
  convergence_threshold = 0.001;
  epsilon = 0.0;
  relative_floor_in_decibels = -1.79769313486232e+308;
  impulse_response_length = 0x80;
  local_11b8 = 0;
  IVar1 = kNumInputOutputFormats;
  do {
    local_1204 = IVar1;
    iVar5 = ya_getopt_long(argc,argv,"m:a:g:c:l:q:o:i:d:e:E:n:h",(option *)0x0,(int *)0x0);
    IVar1 = local_1204;
    switch(iVar5) {
    case 0x61:
      std::__cxx11::string::string
                ((string *)&buffer_for_cepstral_analysis,ya_optarg,(allocator *)&analysis);
      bVar3 = sptk::ConvertStringToDouble((string *)&buffer_for_cepstral_analysis,&alpha);
      if (bVar3) {
        bVar3 = sptk::IsValidAlpha(alpha);
        std::__cxx11::string::~string((string *)&buffer_for_cepstral_analysis);
        IVar1 = local_1204;
        if (bVar3) break;
      }
      else {
        std::__cxx11::string::~string((string *)&buffer_for_cepstral_analysis);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer_for_cepstral_analysis);
      std::operator<<((ostream *)&buffer_for_cepstral_analysis,
                      "The argument for the -a option must be in (-1.0, 1.0)");
      std::__cxx11::string::string((string *)&analysis,"mgcep",(allocator *)&ifs);
      sptk::PrintErrorMessage((string *)&analysis,(ostringstream *)&buffer_for_cepstral_analysis);
      goto LAB_0010537c;
    case 0x62:
    case 0x66:
    case 0x6a:
    case 0x6b:
    case 0x70:
switchD_0010490a_caseD_62:
      anon_unknown.dwarf_42a9::PrintUsage((ostream *)&std::cerr);
      return 1;
    case 99:
      std::__cxx11::string::string
                ((string *)&buffer_for_cepstral_analysis,ya_optarg,(allocator *)&analysis);
      bVar3 = sptk::ConvertStringToInteger((string *)&buffer_for_cepstral_analysis,(int *)&ifs);
      bVar2 = (int)_ifs < 0;
      std::__cxx11::string::~string((string *)&buffer_for_cepstral_analysis);
      if (!bVar3 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer_for_cepstral_analysis);
        poVar7 = std::operator<<((ostream *)&buffer_for_cepstral_analysis,
                                 "The argument for the -c option must be a ");
        std::operator<<(poVar7,"non-negative integer");
        std::__cxx11::string::string((string *)&analysis,"mgcep",(allocator *)&error_message_17);
        sptk::PrintErrorMessage((string *)&analysis,(ostringstream *)&buffer_for_cepstral_analysis);
        goto LAB_0010537c;
      }
      gamma = 0.0;
      IVar1 = local_1204;
      if (_ifs != kLogAmplitudeSpectrumInDecibels) {
        gamma = -1.0 / (double)(int)_ifs;
      }
      break;
    case 100:
      std::__cxx11::string::string
                ((string *)&buffer_for_cepstral_analysis,ya_optarg,(allocator *)&analysis);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)&buffer_for_cepstral_analysis,&convergence_threshold);
      bVar3 = convergence_threshold < 0.0;
      std::__cxx11::string::~string((string *)&buffer_for_cepstral_analysis);
      IVar1 = local_1204;
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer_for_cepstral_analysis);
        std::operator<<((ostream *)&buffer_for_cepstral_analysis,
                        "The argument for the -d option must be a non-negative number");
        std::__cxx11::string::string((string *)&analysis,"mgcep",(allocator *)&ifs);
        sptk::PrintErrorMessage((string *)&analysis,(ostringstream *)&buffer_for_cepstral_analysis);
        goto LAB_0010537c;
      }
      break;
    case 0x65:
      std::__cxx11::string::string
                ((string *)&buffer_for_cepstral_analysis,ya_optarg,(allocator *)&analysis);
      bVar2 = sptk::ConvertStringToDouble((string *)&buffer_for_cepstral_analysis,&epsilon);
      bVar3 = epsilon <= 0.0;
      std::__cxx11::string::~string((string *)&buffer_for_cepstral_analysis);
      IVar1 = local_1204;
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer_for_cepstral_analysis);
        std::operator<<((ostream *)&buffer_for_cepstral_analysis,
                        "The argument for the -e option must be a positive number");
        std::__cxx11::string::string((string *)&analysis,"mgcep",(allocator *)&ifs);
        sptk::PrintErrorMessage((string *)&analysis,(ostringstream *)&buffer_for_cepstral_analysis);
        goto LAB_0010537c;
      }
      break;
    case 0x67:
      std::__cxx11::string::string
                ((string *)&buffer_for_cepstral_analysis,ya_optarg,(allocator *)&analysis);
      bVar3 = sptk::ConvertStringToDouble((string *)&buffer_for_cepstral_analysis,&gamma);
      if (bVar3) {
        bVar3 = sptk::IsValidGamma(gamma);
        std::__cxx11::string::~string((string *)&buffer_for_cepstral_analysis);
        IVar1 = local_1204;
        if (bVar3) break;
      }
      else {
        std::__cxx11::string::~string((string *)&buffer_for_cepstral_analysis);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer_for_cepstral_analysis);
      std::operator<<((ostream *)&buffer_for_cepstral_analysis,
                      "The argument for the -g option must be in [-1.0, 0.0]");
      std::__cxx11::string::string((string *)&analysis,"mgcep",(allocator *)&ifs);
      sptk::PrintErrorMessage((string *)&analysis,(ostringstream *)&buffer_for_cepstral_analysis);
      goto LAB_0010537c;
    case 0x68:
      anon_unknown.dwarf_42a9::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x69:
      std::__cxx11::string::string
                ((string *)&buffer_for_cepstral_analysis,ya_optarg,(allocator *)&analysis);
      bVar3 = sptk::ConvertStringToInteger((string *)&buffer_for_cepstral_analysis,&num_iteration);
      bVar2 = num_iteration < 0;
      std::__cxx11::string::~string((string *)&buffer_for_cepstral_analysis);
      IVar1 = local_1204;
      if (!bVar3 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer_for_cepstral_analysis);
        std::operator<<((ostream *)&buffer_for_cepstral_analysis,
                        "The argument for the -i option must be a non-negative integer");
        std::__cxx11::string::string((string *)&analysis,"mgcep",(allocator *)&ifs);
        sptk::PrintErrorMessage((string *)&analysis,(ostringstream *)&buffer_for_cepstral_analysis);
        goto LAB_0010537c;
      }
      break;
    case 0x6c:
      std::__cxx11::string::string
                ((string *)&buffer_for_cepstral_analysis,ya_optarg,(allocator *)&analysis);
      bVar3 = sptk::ConvertStringToInteger((string *)&buffer_for_cepstral_analysis,&fft_length);
      std::__cxx11::string::~string((string *)&buffer_for_cepstral_analysis);
      IVar1 = local_1204;
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer_for_cepstral_analysis);
        std::operator<<((ostream *)&buffer_for_cepstral_analysis,
                        "The argument for the -l option must be an integer");
        std::__cxx11::string::string((string *)&analysis,"mgcep",(allocator *)&ifs);
        sptk::PrintErrorMessage((string *)&analysis,(ostringstream *)&buffer_for_cepstral_analysis);
        goto LAB_0010537c;
      }
      break;
    case 0x6d:
      std::__cxx11::string::string
                ((string *)&buffer_for_cepstral_analysis,ya_optarg,(allocator *)&analysis);
      bVar3 = sptk::ConvertStringToInteger((string *)&buffer_for_cepstral_analysis,&num_order);
      bVar2 = num_order < 0;
      std::__cxx11::string::~string((string *)&buffer_for_cepstral_analysis);
      IVar1 = local_1204;
      if (!bVar3 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer_for_cepstral_analysis);
        poVar7 = std::operator<<((ostream *)&buffer_for_cepstral_analysis,
                                 "The argument for the -m option must be a ");
        std::operator<<(poVar7,"non-negative integer");
        std::__cxx11::string::string((string *)&analysis,"mgcep",(allocator *)&ifs);
        sptk::PrintErrorMessage((string *)&analysis,(ostringstream *)&buffer_for_cepstral_analysis);
        goto LAB_0010537c;
      }
      break;
    case 0x6e:
      std::__cxx11::string::string
                ((string *)&buffer_for_cepstral_analysis,ya_optarg,(allocator *)&analysis);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)&buffer_for_cepstral_analysis,&impulse_response_length);
      bVar3 = impulse_response_length < 1;
      std::__cxx11::string::~string((string *)&buffer_for_cepstral_analysis);
      IVar1 = local_1204;
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer_for_cepstral_analysis);
        std::operator<<((ostream *)&buffer_for_cepstral_analysis,
                        "The argument for the -n option must be a positive integer");
        std::__cxx11::string::string((string *)&analysis,"mgcep",(allocator *)&ifs);
        sptk::PrintErrorMessage((string *)&analysis,(ostringstream *)&buffer_for_cepstral_analysis);
        goto LAB_0010537c;
      }
      break;
    case 0x6f:
      std::__cxx11::string::string
                ((string *)&buffer_for_cepstral_analysis,ya_optarg,(allocator *)&analysis);
      bVar3 = sptk::ConvertStringToInteger((string *)&buffer_for_cepstral_analysis,(int *)&ifs);
      if (bVar3) {
        bVar3 = sptk::IsInRange(_ifs,0,4);
        std::__cxx11::string::~string((string *)&buffer_for_cepstral_analysis);
        if (bVar3) {
          local_11b8 = (ulong)_ifs;
          IVar1 = local_1204;
          break;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&buffer_for_cepstral_analysis);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer_for_cepstral_analysis);
      poVar7 = std::operator<<((ostream *)&buffer_for_cepstral_analysis,
                               "The argument for the -o option must be an integer ");
      poVar7 = std::operator<<(poVar7,"in the range of ");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0);
      poVar7 = std::operator<<(poVar7," to ");
      std::ostream::operator<<((ostream *)poVar7,4);
      std::__cxx11::string::string((string *)&analysis,"mgcep",(allocator *)&error_message_17);
      sptk::PrintErrorMessage((string *)&analysis,(ostringstream *)&buffer_for_cepstral_analysis);
      goto LAB_0010537c;
    case 0x71:
      std::__cxx11::string::string
                ((string *)&buffer_for_cepstral_analysis,ya_optarg,(allocator *)&analysis);
      bVar3 = sptk::ConvertStringToInteger((string *)&buffer_for_cepstral_analysis,(int *)&ifs);
      if (bVar3) {
        bVar3 = sptk::IsInRange(_ifs,0,4);
        std::__cxx11::string::~string((string *)&buffer_for_cepstral_analysis);
        IVar1 = _ifs;
        if (bVar3) break;
      }
      else {
        std::__cxx11::string::~string((string *)&buffer_for_cepstral_analysis);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer_for_cepstral_analysis);
      poVar7 = std::operator<<((ostream *)&buffer_for_cepstral_analysis,
                               "The argument for the -q option must be an integer ");
      poVar7 = std::operator<<(poVar7,"in the range of ");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0);
      poVar7 = std::operator<<(poVar7," to ");
      std::ostream::operator<<((ostream *)poVar7,4);
      std::__cxx11::string::string((string *)&analysis,"mgcep",(allocator *)&error_message_17);
      sptk::PrintErrorMessage((string *)&analysis,(ostringstream *)&buffer_for_cepstral_analysis);
      goto LAB_0010537c;
    default:
      if (iVar5 != 0x45) {
        if (iVar5 != -1) goto switchD_0010490a_caseD_62;
        if (1 < argc - ya_optind) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer_for_cepstral_analysis)
          ;
          std::operator<<((ostream *)&buffer_for_cepstral_analysis,"Too many input files");
          std::__cxx11::string::string((string *)&analysis,"mgcep",(allocator *)&ifs);
          sptk::PrintErrorMessage
                    ((string *)&analysis,(ostringstream *)&buffer_for_cepstral_analysis);
          goto LAB_0010537c;
        }
        if (argc == ya_optind) {
          pcVar8 = (char *)0x0;
        }
        else {
          pcVar8 = argv[ya_optind];
        }
        bVar3 = sptk::SetBinaryMode();
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer_for_cepstral_analysis)
          ;
          std::operator<<((ostream *)&buffer_for_cepstral_analysis,"Cannot set translation mode");
          std::__cxx11::string::string((string *)&analysis,"mgcep",(allocator *)&ifs);
          sptk::PrintErrorMessage
                    ((string *)&analysis,(ostringstream *)&buffer_for_cepstral_analysis);
          goto LAB_0010537c;
        }
        input_stream = (istream *)&ifs;
        std::ifstream::ifstream(input_stream);
        if ((pcVar8 != (char *)0x0) &&
           (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar8),
           (abStack_c08[*(long *)(CONCAT44(uStack_c24,_ifs) + -0x18)] & 5) != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer_for_cepstral_analysis)
          ;
          poVar7 = std::operator<<((ostream *)&buffer_for_cepstral_analysis,"Cannot open file ");
          std::operator<<(poVar7,pcVar8);
          std::__cxx11::string::string((string *)&analysis,"mgcep",(allocator *)&error_message_17);
          sptk::PrintErrorMessage
                    ((string *)&analysis,(ostringstream *)&buffer_for_cepstral_analysis);
          std::__cxx11::string::~string((string *)&analysis);
          std::__cxx11::ostringstream::~ostringstream
                    ((ostringstream *)&buffer_for_cepstral_analysis);
          iVar5 = 1;
          goto LAB_00105a37;
        }
        cVar4 = std::__basic_file<char>::is_open();
        if (cVar4 == '\0') {
          input_stream = (istream *)&std::cin;
        }
        sptk::SpectrumToSpectrum::SpectrumToSpectrum
                  (&spectrum_to_spectrum,fft_length,IVar1,kPowerSpectrum,epsilon,
                   relative_floor_in_decibels);
        if ((IVar1 != kNumInputOutputFormats) && (spectrum_to_spectrum.is_valid_ == false)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer_for_cepstral_analysis)
          ;
          std::operator<<((ostream *)&buffer_for_cepstral_analysis,
                          "Failed to set condition for input formatting");
          std::__cxx11::string::string((string *)&analysis,"mgcep",(allocator *)&error_message_17);
          sptk::PrintErrorMessage
                    ((string *)&analysis,(ostringstream *)&buffer_for_cepstral_analysis);
          std::__cxx11::string::~string((string *)&analysis);
          std::__cxx11::ostringstream::~ostringstream
                    ((ostringstream *)&buffer_for_cepstral_analysis);
          iVar5 = 1;
          goto LAB_00105a2a;
        }
        sptk::WaveformToSpectrum::WaveformToSpectrum
                  (&waveform_to_spectrum,fft_length,fft_length,kPowerSpectrum,epsilon,
                   relative_floor_in_decibels);
        buffer_for_spectral_analysis._vptr_Buffer = (_func_int **)&PTR__Buffer_0011e1d0;
        buffer_for_spectral_analysis.buffer_._vptr_Buffer = (_func_int **)&PTR__Buffer_0011e200;
        buffer_for_spectral_analysis.buffer_.fast_fourier_transform_buffer_._vptr_Buffer =
             (_func_int **)&PTR__Buffer_0011e230;
        memset(&buffer_for_spectral_analysis.buffer_.fast_fourier_transform_buffer_.real_part_input_
               ,0,0xa8);
        if ((IVar1 == kNumInputOutputFormats) &&
           (waveform_to_spectrum.filter_coefficients_to_spectrum_.is_valid_ == false)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer_for_cepstral_analysis)
          ;
          std::operator<<((ostream *)&buffer_for_cepstral_analysis,
                          "Failed to set condition for spectral analysis");
          std::__cxx11::string::string((string *)&analysis,"mgcep",(allocator *)&error_message_17);
          sptk::PrintErrorMessage
                    ((string *)&analysis,(ostringstream *)&buffer_for_cepstral_analysis);
          std::__cxx11::string::~string((string *)&analysis);
          std::__cxx11::ostringstream::~ostringstream
                    ((ostringstream *)&buffer_for_cepstral_analysis);
          iVar5 = 1;
          goto LAB_00105a10;
        }
        sptk::MelGeneralizedCepstralAnalysis::MelGeneralizedCepstralAnalysis
                  (&analysis,fft_length,num_order,alpha,gamma,num_iteration,convergence_threshold);
        sptk::MelGeneralizedCepstralAnalysis::Buffer::Buffer(&buffer_for_cepstral_analysis);
        if (analysis.is_valid_ == false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_17);
          std::operator<<((ostream *)&error_message_17,
                          "Failed to set condition for cepstral analysis");
          std::__cxx11::string::string
                    ((string *)&buffer_for_power_normalization,"mgcep",
                     (allocator *)&mel_cepstrum_power_normalization);
          sptk::PrintErrorMessage((string *)&buffer_for_power_normalization,&error_message_17);
        }
        else {
          sptk::MelCepstrumToMlsaDigitalFilterCoefficients::
          MelCepstrumToMlsaDigitalFilterCoefficients
                    (&mel_cepstrum_to_mlsa_digital_filter_coefficients,num_order,alpha);
          if (mel_cepstrum_to_mlsa_digital_filter_coefficients.is_valid_ == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_17);
            std::operator<<((ostream *)&error_message_17,
                            "Failed to set condition for output formatting");
            std::__cxx11::string::string
                      ((string *)&buffer_for_power_normalization,"mgcep",
                       (allocator *)&mel_cepstrum_power_normalization);
            sptk::PrintErrorMessage((string *)&buffer_for_power_normalization,&error_message_17);
          }
          else {
            sptk::GeneralizedCepstrumGainNormalization::GeneralizedCepstrumGainNormalization
                      (&generalized_cepstrum_gain_normalization,num_order,gamma);
            if (generalized_cepstrum_gain_normalization.is_valid_ != false) {
              sptk::MelCepstrumPowerNormalization::MelCepstrumPowerNormalization
                        (&mel_cepstrum_power_normalization,num_order,impulse_response_length,alpha);
              buffer_for_power_normalization._vptr_Buffer = (_func_int **)&PTR__Buffer_0011e380;
              buffer_for_power_normalization.cepstrum_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              buffer_for_power_normalization.cepstrum_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)0x0;
              buffer_for_power_normalization.cepstrum_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = (pointer)0x0;
              buffer_for_power_normalization.autocorrelation_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              buffer_for_power_normalization.autocorrelation_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)0x0;
              buffer_for_power_normalization.autocorrelation_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = (pointer)0x0;
              buffer_for_power_normalization.buffer_for_frequency_transform_._vptr_Buffer =
                   (_func_int **)&PTR__Buffer_0011e320;
              buffer_for_power_normalization.buffer_for_frequency_transform_.d_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = (pointer)0x0;
              buffer_for_power_normalization.buffer_for_frequency_transform_.d_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              buffer_for_power_normalization.buffer_for_frequency_transform_.d_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)0x0;
              buffer_for_power_normalization.buffer_for_cepstrum_to_autocorrelation_._vptr_Buffer =
                   (_func_int **)&PTR__Buffer_0011e3b0;
              buffer_for_power_normalization.buffer_for_cepstrum_to_autocorrelation_.real_part_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              buffer_for_power_normalization.buffer_for_cepstrum_to_autocorrelation_.real_part_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)0x0;
              buffer_for_power_normalization.buffer_for_cepstrum_to_autocorrelation_.real_part_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = (pointer)0x0;
              buffer_for_power_normalization.buffer_for_cepstrum_to_autocorrelation_.imag_part_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              buffer_for_power_normalization.buffer_for_cepstrum_to_autocorrelation_.imag_part_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)0x0;
              buffer_for_power_normalization.buffer_for_cepstrum_to_autocorrelation_.imag_part_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = (pointer)0x0;
              buffer_for_power_normalization.buffer_for_cepstrum_to_autocorrelation_.
              buffer_for_fast_fourier_transform_._vptr_Buffer = (_func_int **)&PTR__Buffer_0011e230;
              buffer_for_power_normalization.buffer_for_cepstrum_to_autocorrelation_.
              buffer_for_fast_fourier_transform_.real_part_input_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              buffer_for_power_normalization.buffer_for_cepstrum_to_autocorrelation_.
              buffer_for_fast_fourier_transform_.real_part_input_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)0x0;
              buffer_for_power_normalization.buffer_for_cepstrum_to_autocorrelation_.
              buffer_for_fast_fourier_transform_.real_part_input_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = (pointer)0x0;
              buffer_for_power_normalization.buffer_for_cepstrum_to_autocorrelation_.
              buffer_for_fast_fourier_transform_.imag_part_input_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              buffer_for_power_normalization.buffer_for_cepstrum_to_autocorrelation_.
              buffer_for_fast_fourier_transform_.imag_part_input_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)0x0;
              buffer_for_power_normalization.buffer_for_cepstrum_to_autocorrelation_.
              buffer_for_fast_fourier_transform_.imag_part_input_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage = (pointer)0x0;
              if (mel_cepstrum_power_normalization.is_valid_ == false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_17);
                std::operator<<((ostream *)&error_message_17,
                                "Failed to set condition for power normalization");
                std::__cxx11::string::string((string *)&local_1200,"mgcep",(allocator *)&input);
                sptk::PrintErrorMessage(&local_1200,&error_message_17);
                std::__cxx11::string::~string((string *)&local_1200);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_17);
                iVar5 = 1;
                goto LAB_00105d10;
              }
              iVar5 = fft_length;
              if (IVar1 != kNumInputOutputFormats) {
                iVar5 = fft_length / 2 + 1;
              }
              lVar9 = (long)num_order;
              std::vector<double,_std::allocator<double>_>::vector
                        (&input,(long)iVar5,(allocator_type *)&error_message_17);
              std::vector<double,_std::allocator<double>_>::vector
                        (&processed_input,(long)(fft_length / 2 + 1),
                         (allocator_type *)&error_message_17);
              std::vector<double,_std::allocator<double>_>::vector
                        (&output,lVar9 + 1U,(allocator_type *)&error_message_17);
              uVar6 = (uint)local_11b8;
              goto LAB_00105646;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_17);
            std::operator<<((ostream *)&error_message_17,
                            "Failed to set condition for gain normalization");
            std::__cxx11::string::string
                      ((string *)&buffer_for_power_normalization,"mgcep",
                       (allocator *)&mel_cepstrum_power_normalization);
            sptk::PrintErrorMessage((string *)&buffer_for_power_normalization,&error_message_17);
          }
        }
        std::__cxx11::string::~string((string *)&buffer_for_power_normalization);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_17);
        iVar5 = 1;
        goto LAB_001059f6;
      }
      std::__cxx11::string::string
                ((string *)&buffer_for_cepstral_analysis,ya_optarg,(allocator *)&analysis);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)&buffer_for_cepstral_analysis,&relative_floor_in_decibels);
      bVar3 = 0.0 <= relative_floor_in_decibels;
      std::__cxx11::string::~string((string *)&buffer_for_cepstral_analysis);
      IVar1 = local_1204;
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&buffer_for_cepstral_analysis);
        std::operator<<((ostream *)&buffer_for_cepstral_analysis,
                        "The argument for the -E option must be a negative number");
        std::__cxx11::string::string((string *)&analysis,"mgcep",(allocator *)&ifs);
        sptk::PrintErrorMessage((string *)&analysis,(ostringstream *)&buffer_for_cepstral_analysis);
LAB_0010537c:
        std::__cxx11::string::~string((string *)&analysis);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buffer_for_cepstral_analysis);
        return 1;
      }
    }
  } while( true );
LAB_00105646:
  do {
    bVar3 = sptk::ReadStream<double>(false,0,0,iVar5,&input,input_stream,(int *)0x0);
    if (!bVar3) {
      iVar5 = 0;
      goto LAB_00105cec;
    }
    if (local_1204 == kNumInputOutputFormats) {
      bVar3 = sptk::WaveformToSpectrum::Run
                        (&waveform_to_spectrum,&input,&processed_input,&buffer_for_spectral_analysis
                        );
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_17);
        std::operator<<((ostream *)&error_message_17,"Failed to transform waveform to spectrum");
        std::__cxx11::string::string((string *)&local_1200,"mgcep",&local_120d);
        sptk::PrintErrorMessage(&local_1200,&error_message_17);
        goto LAB_00105cd2;
      }
    }
    else {
      bVar3 = sptk::SpectrumToSpectrum::Run(&spectrum_to_spectrum,&input,&processed_input);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_17);
        std::operator<<((ostream *)&error_message_17,"Failed to convert spectrum");
        std::__cxx11::string::string((string *)&local_1200,"mgcep",&local_120d);
        sptk::PrintErrorMessage(&local_1200,&error_message_17);
        goto LAB_00105cd2;
      }
    }
    bVar3 = sptk::MelGeneralizedCepstralAnalysis::Run
                      (&analysis,&processed_input,&output,&buffer_for_cepstral_analysis);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_17);
      std::operator<<((ostream *)&error_message_17,"Failed to run mel-generalized cepstral analysis"
                     );
      std::__cxx11::string::string((string *)&local_1200,"mgcep",&local_120d);
      sptk::PrintErrorMessage(&local_1200,&error_message_17);
      goto LAB_00105cd2;
    }
    if ((alpha != 0.0 && (uVar6 & 0xfffffffd) == 1) &&
       (bVar3 = sptk::MelCepstrumToMlsaDigitalFilterCoefficients::Run
                          (&mel_cepstrum_to_mlsa_digital_filter_coefficients,&output), !bVar3)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_17);
      std::operator<<((ostream *)&error_message_17,"Failed to convert to MLSA filter coefficients");
      std::__cxx11::string::string((string *)&local_1200,"mgcep",&local_120d);
      sptk::PrintErrorMessage(&local_1200,&error_message_17);
      goto LAB_00105cd2;
    }
    if ((uVar6 & 0xfffffffe) == 2) {
      bVar3 = sptk::GeneralizedCepstrumGainNormalization::Run
                        (&generalized_cepstrum_gain_normalization,&output);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_17);
        std::operator<<((ostream *)&error_message_17,"Failed to gain-normalize cepstrum");
        std::__cxx11::string::string((string *)&local_1200,"mgcep",&local_120d);
        sptk::PrintErrorMessage(&local_1200,&error_message_17);
        goto LAB_00105cd2;
      }
    }
    else if ((int)local_11b8 == 4) {
      bVar3 = sptk::MelCepstrumPowerNormalization::Run
                        (&mel_cepstrum_power_normalization,&output,&power,
                         &buffer_for_power_normalization);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_17);
        std::operator<<((ostream *)&error_message_17,"Failed to power-normalize cepstrum");
        std::__cxx11::string::string((string *)&local_1200,"mgcep",&local_120d);
        sptk::PrintErrorMessage(&local_1200,&error_message_17);
        goto LAB_00105cd2;
      }
      bVar3 = sptk::WriteStream<double>(power,(ostream *)&std::cout);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_17);
        std::operator<<((ostream *)&error_message_17,"Failed to write power");
        std::__cxx11::string::string((string *)&local_1200,"mgcep",&local_120d);
        sptk::PrintErrorMessage(&local_1200,&error_message_17);
        goto LAB_00105cd2;
      }
    }
    bVar3 = sptk::WriteStream<double>(0,(int)(lVar9 + 1U),&output,(ostream *)&std::cout,(int *)0x0);
  } while (bVar3);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_17);
  std::operator<<((ostream *)&error_message_17,"Failed to write mel-generalized cepstrum");
  std::__cxx11::string::string((string *)&local_1200,"mgcep",&local_120d);
  sptk::PrintErrorMessage(&local_1200,&error_message_17);
LAB_00105cd2:
  std::__cxx11::string::~string((string *)&local_1200);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_17);
  iVar5 = 1;
LAB_00105cec:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&output.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&processed_input.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&input.super__Vector_base<double,_std::allocator<double>_>);
LAB_00105d10:
  sptk::MelCepstrumPowerNormalization::Buffer::~Buffer(&buffer_for_power_normalization);
  sptk::MelCepstrumPowerNormalization::~MelCepstrumPowerNormalization
            (&mel_cepstrum_power_normalization);
LAB_001059f6:
  sptk::MelGeneralizedCepstralAnalysis::Buffer::~Buffer(&buffer_for_cepstral_analysis);
  sptk::MelGeneralizedCepstralAnalysis::~MelGeneralizedCepstralAnalysis(&analysis);
LAB_00105a10:
  sptk::WaveformToSpectrum::Buffer::~Buffer(&buffer_for_spectral_analysis);
  sptk::WaveformToSpectrum::~WaveformToSpectrum(&waveform_to_spectrum);
LAB_00105a2a:
  sptk::SpectrumToSpectrum::~SpectrumToSpectrum(&spectrum_to_spectrum);
LAB_00105a37:
  std::ifstream::~ifstream(&ifs);
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  double alpha(kDefaultAlpha);
  double gamma(kDefaultGamma);
  int fft_length(kDefaultFftLength);
  InputFormats input_format(kDefaultInputFormat);
  OutputFormats output_format(kDefaultOutputFormat);
  int num_iteration(kDefaultNumIteration);
  double convergence_threshold(kDefaultConvergenceThreshold);
  double epsilon(0.0);
  double relative_floor_in_decibels(sptk::kMin);
  int impulse_response_length(kDefaultImpulseResponseLength);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "m:a:g:c:l:q:o:i:d:e:E:n:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &alpha) ||
            !sptk::IsValidAlpha(alpha)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -a option must be in (-1.0, 1.0)";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'g': {
        if (!sptk::ConvertStringToDouble(optarg, &gamma) ||
            !sptk::IsValidGamma(gamma)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -g option must be in [-1.0, 0.0]";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) || tmp < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -c option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        gamma = (0 == tmp) ? 0.0 : -1.0 / tmp;
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &num_iteration) ||
            num_iteration < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'd': {
        if (!sptk::ConvertStringToDouble(optarg, &convergence_threshold) ||
            convergence_threshold < 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -d option must be a non-negative number";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToDouble(optarg, &epsilon) || epsilon <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -e option must be a positive number";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'E': {
        if (!sptk::ConvertStringToDouble(optarg, &relative_floor_in_decibels) ||
            0.0 <= relative_floor_in_decibels) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -E option must be a negative number";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'n': {
        if (!sptk::ConvertStringToInteger(optarg, &impulse_response_length) ||
            impulse_response_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -n option must be a positive integer";
          sptk::PrintErrorMessage("mgcep", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("mgcep", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::SpectrumToSpectrum spectrum_to_spectrum(
      fft_length,
      static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(input_format),
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum, epsilon,
      relative_floor_in_decibels);
  if (kWaveform != input_format && !spectrum_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for input formatting";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  sptk::WaveformToSpectrum waveform_to_spectrum(
      fft_length, fft_length,
      sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum, epsilon,
      relative_floor_in_decibels);
  sptk::WaveformToSpectrum::Buffer buffer_for_spectral_analysis;
  if (kWaveform == input_format && !waveform_to_spectrum.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for spectral analysis";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  sptk::MelGeneralizedCepstralAnalysis analysis(fft_length, num_order, alpha,
                                                gamma, num_iteration,
                                                convergence_threshold);
  sptk::MelGeneralizedCepstralAnalysis::Buffer buffer_for_cepstral_analysis;
  if (!analysis.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for cepstral analysis";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  sptk::MelCepstrumToMlsaDigitalFilterCoefficients
      mel_cepstrum_to_mlsa_digital_filter_coefficients(num_order, alpha);
  if (!mel_cepstrum_to_mlsa_digital_filter_coefficients.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for output formatting";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  sptk::GeneralizedCepstrumGainNormalization
      generalized_cepstrum_gain_normalization(num_order, gamma);
  if (!generalized_cepstrum_gain_normalization.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for gain normalization";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  sptk::MelCepstrumPowerNormalization mel_cepstrum_power_normalization(
      num_order, impulse_response_length, alpha);
  sptk::MelCepstrumPowerNormalization::Buffer buffer_for_power_normalization;
  if (!mel_cepstrum_power_normalization.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to set condition for power normalization";
    sptk::PrintErrorMessage("mgcep", error_message);
    return 1;
  }

  const int input_length(kWaveform == input_format ? fft_length
                                                   : fft_length / 2 + 1);
  const int output_length(num_order + 1);
  std::vector<double> input(input_length);
  std::vector<double> processed_input(fft_length / 2 + 1);
  std::vector<double> output(output_length);
  double power;

  while (sptk::ReadStream(false, 0, 0, input_length, &input, &input_stream,
                          NULL)) {
    if (kWaveform == input_format) {
      if (!waveform_to_spectrum.Run(input, &processed_input,
                                    &buffer_for_spectral_analysis)) {
        std::ostringstream error_message;
        error_message << "Failed to transform waveform to spectrum";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
    } else {
      if (!spectrum_to_spectrum.Run(input, &processed_input)) {
        std::ostringstream error_message;
        error_message << "Failed to convert spectrum";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
    }

    if (!analysis.Run(processed_input, &output,
                      &buffer_for_cepstral_analysis)) {
      std::ostringstream error_message;
      error_message << "Failed to run mel-generalized cepstral analysis";
      sptk::PrintErrorMessage("mgcep", error_message);
      return 1;
    }

    // mc -> b
    if (0.0 != alpha &&
        (kMlsaFilterCoefficients == output_format ||
         kGainNormalizedMlsaFilterCoefficients == output_format)) {
      if (!mel_cepstrum_to_mlsa_digital_filter_coefficients.Run(&output)) {
        std::ostringstream error_message;
        error_message << "Failed to convert to MLSA filter coefficients";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
    }

    // gnorm
    if (kGainNormalizedCepstrum == output_format ||
        kGainNormalizedMlsaFilterCoefficients == output_format) {
      if (!generalized_cepstrum_gain_normalization.Run(&output)) {
        std::ostringstream error_message;
        error_message << "Failed to gain-normalize cepstrum";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
    }

    // pnorm
    if (kPowerNormalizedCepstrum == output_format) {
      if (!mel_cepstrum_power_normalization.Run(
              &output, &power, &buffer_for_power_normalization)) {
        std::ostringstream error_message;
        error_message << "Failed to power-normalize cepstrum";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
      if (!sptk::WriteStream(power, &std::cout)) {
        std::ostringstream error_message;
        error_message << "Failed to write power";
        sptk::PrintErrorMessage("mgcep", error_message);
        return 1;
      }
    }

    if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write mel-generalized cepstrum";
      sptk::PrintErrorMessage("mgcep", error_message);
      return 1;
    }
  }

  return 0;
}